

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O0

void __thiscall
GdlSlotRefExpression::GenerateEngineCode
          (GdlSlotRefExpression *this,uint32_t param_2,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vbOutput,int iritCurrent,
          vector<int,_std::allocator<int>_> *pviritInput,int param_6,bool param_7,int param_8,
          int *pnValue)

{
  undefined1 uVar1;
  int iVar2;
  reference pvVar3;
  int in_ECX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  undefined4 in_R9D;
  undefined1 in_stack_00000008;
  sdata8 offset8;
  int nOffset;
  undefined3 in_stack_00000018;
  value_type_conflict3 *in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffc8;
  undefined1 uVar4;
  undefined3 in_stack_ffffffffffffffd0;
  uint uVar5;
  
  uVar5 = CONCAT13(in_stack_00000008,in_stack_ffffffffffffffd0) & 0x1ffffff;
  iVar2 = *(int *)&in_RDI[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage - in_ECX;
  if (in_R8 != (vector<int,_std::allocator<int>_> *)0x0) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (in_R8,(long)*(int *)&in_RDI[3].
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar2 = *pvVar3 - in_ECX;
  }
  uVar1 = (undefined1)iVar2;
  *(int *)CONCAT44(param_6,_in_stack_00000018) = iVar2;
  uVar4 = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (in_RDI,in_stack_ffffffffffffffb8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(in_R9D,uVar5),
             (value_type_conflict3 *)
             CONCAT44(iVar2,CONCAT13(uVar1,CONCAT12(uVar4,in_stack_ffffffffffffffc8))));
  return;
}

Assistant:

void GdlSlotRefExpression::GenerateEngineCode(uint32_t /*fxdRuleVersion*/, std::vector<gr::byte> & vbOutput,
	int iritCurrent, std::vector<int> * pviritInput, int /*nIIndex*/,
	bool /*fAttachAt*/, int /*iritAttachTo*/, int * pnValue)
{
	int nOffset = m_nIOIndex - iritCurrent;

	Assert(!pviritInput);	// should not be used for constraints
	if (pviritInput)
		nOffset = (*pviritInput)[m_nIOIndex] - iritCurrent;

	Assert(-128 <= nOffset && nOffset < 128); // Check this fits in 8 bits.
	gr::sdata8 const offset8 = nOffset;
	//	If this happens to be the value of an attach.to attribute, current or following
	//	slot needs to have insert = false set.
	*pnValue = nOffset;

	vbOutput.push_back(kopPushByte);
	vbOutput.push_back(reinterpret_cast<gr::byte const &>(offset8));
}